

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::setBaseSize(QWidget *this,int basew,int baseh)

{
  bool bVar1;
  QWidgetPrivate *this_00;
  QTLWExtra *this_01;
  int in_EDX;
  int in_ESI;
  QTLWExtra *x;
  QWidgetPrivate *d;
  QWidgetPrivate *in_stack_ffffffffffffffe0;
  
  this_00 = d_func((QWidget *)0x36b643);
  QWidgetPrivate::createTLExtra(this_00);
  this_01 = QWidgetPrivate::topData(in_stack_ffffffffffffffe0);
  if ((this_01->basew != in_ESI) || (this_01->baseh != in_EDX)) {
    this_01->basew = (short)in_ESI;
    this_01->baseh = (short)in_EDX;
    bVar1 = isWindow((QWidget *)this_01);
    if (bVar1) {
      QWidgetPrivate::setConstraints_sys((QWidgetPrivate *)x);
    }
  }
  return;
}

Assistant:

void QWidget::setBaseSize(int basew, int baseh)
{
    Q_D(QWidget);
    d->createTLExtra();
    QTLWExtra* x = d->topData();
    if (x->basew == basew && x->baseh == baseh)
        return;
    x->basew = basew;
    x->baseh = baseh;
    if (isWindow())
        d->setConstraints_sys();
}